

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# status.cpp
# Opt level: O0

vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
* ls_abi_cxx11_(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *__return_storage_ptr__,char *dir_name)

{
  DIR *__dirp;
  char *pcVar1;
  allocator local_2f1;
  string local_2f0 [8];
  string s;
  undefined1 local_2d0 [8];
  stat sb;
  dirent *myfile;
  char buf [512];
  DIR *mydir;
  char *dir_name_local;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *result;
  
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(__return_storage_ptr__);
  __dirp = opendir(dir_name);
  if (__dirp != (DIR *)0x0) {
    while (sb.__glibc_reserved[2] = (__syscall_slong_t)readdir(__dirp),
          (dirent *)sb.__glibc_reserved[2] != (dirent *)0x0) {
      sprintf((char *)&myfile,"%s/%s",dir_name,((dirent *)sb.__glibc_reserved[2])->d_name);
      stat((char *)&myfile,(stat *)local_2d0);
      if (((uint)sb.st_nlink & 0xf000) != 0x4000) {
        pcVar1 = (char *)(sb.__glibc_reserved[2] + 0x13);
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_2f0,pcVar1,&local_2f1);
        std::allocator<char>::~allocator((allocator<char> *)&local_2f1);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back(__return_storage_ptr__,(value_type *)local_2f0);
        std::__cxx11::string::~string(local_2f0);
      }
    }
  }
  return __return_storage_ptr__;
}

Assistant:

Vector<String> ls(const char * dir_name){
    Vector<String> result;
    DIR *mydir = opendir(dir_name);
    if(mydir != NULL){
        char buf[512];
        struct dirent *myfile;
        while((myfile = readdir(mydir)) != NULL){
            struct stat sb;
            sprintf(buf, "%s/%s",dir_name, myfile->d_name);
            stat(buf, &sb);
            if(!S_ISDIR(sb.st_mode)!=0){\
                String s = myfile->d_name;
                result.push_back(s);
            }
        }
    }
    return result;
}